

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_OES_texture_border_clamp(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_OES_texture_border_clamp != 0) {
    glad_glTexParameterIivOES = (PFNGLTEXPARAMETERIIVOESPROC)(*in_RDI)("glTexParameterIivOES");
    glad_glTexParameterIuivOES = (PFNGLTEXPARAMETERIUIVOESPROC)(*in_RDI)("glTexParameterIuivOES");
    glad_glGetTexParameterIivOES =
         (PFNGLGETTEXPARAMETERIIVOESPROC)(*in_RDI)("glGetTexParameterIivOES");
    glad_glGetTexParameterIuivOES =
         (PFNGLGETTEXPARAMETERIUIVOESPROC)(*in_RDI)("glGetTexParameterIuivOES");
    glad_glSamplerParameterIivOES =
         (PFNGLSAMPLERPARAMETERIIVOESPROC)(*in_RDI)("glSamplerParameterIivOES");
    glad_glSamplerParameterIuivOES =
         (PFNGLSAMPLERPARAMETERIUIVOESPROC)(*in_RDI)("glSamplerParameterIuivOES");
    glad_glGetSamplerParameterIivOES =
         (PFNGLGETSAMPLERPARAMETERIIVOESPROC)(*in_RDI)("glGetSamplerParameterIivOES");
    glad_glGetSamplerParameterIuivOES =
         (PFNGLGETSAMPLERPARAMETERIUIVOESPROC)(*in_RDI)("glGetSamplerParameterIuivOES");
  }
  return;
}

Assistant:

static void load_GL_OES_texture_border_clamp(GLADloadproc load) {
	if(!GLAD_GL_OES_texture_border_clamp) return;
	glad_glTexParameterIivOES = (PFNGLTEXPARAMETERIIVOESPROC)load("glTexParameterIivOES");
	glad_glTexParameterIuivOES = (PFNGLTEXPARAMETERIUIVOESPROC)load("glTexParameterIuivOES");
	glad_glGetTexParameterIivOES = (PFNGLGETTEXPARAMETERIIVOESPROC)load("glGetTexParameterIivOES");
	glad_glGetTexParameterIuivOES = (PFNGLGETTEXPARAMETERIUIVOESPROC)load("glGetTexParameterIuivOES");
	glad_glSamplerParameterIivOES = (PFNGLSAMPLERPARAMETERIIVOESPROC)load("glSamplerParameterIivOES");
	glad_glSamplerParameterIuivOES = (PFNGLSAMPLERPARAMETERIUIVOESPROC)load("glSamplerParameterIuivOES");
	glad_glGetSamplerParameterIivOES = (PFNGLGETSAMPLERPARAMETERIIVOESPROC)load("glGetSamplerParameterIivOES");
	glad_glGetSamplerParameterIuivOES = (PFNGLGETSAMPLERPARAMETERIUIVOESPROC)load("glGetSamplerParameterIuivOES");
}